

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_FindFileContainingSymbol_Test::
~DescriptorDatabaseTest_FindFileContainingSymbol_Test
          (DescriptorDatabaseTest_FindFileContainingSymbol_Test *this)

{
  DescriptorDatabaseTestCase *pDVar1;
  
  (this->super_DescriptorDatabaseTest).
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>.
  super_Test._vptr_Test = (_func_int **)&PTR__DescriptorDatabaseTest_018d32c8;
  (this->super_DescriptorDatabaseTest).
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>.
  super_WithParamInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
  ._vptr_WithParamInterface = (_func_int **)&PTR__DescriptorDatabaseTest_018d3308;
  pDVar1 = (this->super_DescriptorDatabaseTest).test_case_._M_t.
           super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
           .
           super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_false>
           ._M_head_impl;
  if (pDVar1 != (DescriptorDatabaseTestCase *)0x0) {
    (*pDVar1->_vptr_DescriptorDatabaseTestCase[1])();
  }
  (this->super_DescriptorDatabaseTest).test_case_._M_t.
  super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
  .
  super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_false>
  ._M_head_impl = (DescriptorDatabaseTestCase *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, FindFileContainingSymbol) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "  field { name:\"qux\" }"
      "  nested_type { name: \"Grault\" } "
      "  enum_type { name: \"Garply\" } "
      "} "
      "enum_type { "
      "  name: \"Waldo\" "
      "  value { name:\"FRED\" } "
      "} "
      "extension { name: \"plugh\" } "
      "service { "
      "  name: \"Xyzzy\" "
      "  method { name: \"Thud\" } "
      "}");
  AddToDatabase(
      "name: \"bar.proto\" "
      "package: \"corge\" "
      "message_type { name: \"Bar\" }");

  {
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Foo", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find fields.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Foo.qux", &file));
    EXPECT_EQ("foo.proto", file.name());
    // Non-existent field under a valid top level symbol can also be
    // found.
    EXPECT_TRUE(
        database_->FindFileContainingSymbol("Foo.none_field.none", &file));
  }

  {
    // Can find nested types.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Foo.Grault", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find nested enums.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Foo.Garply", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find enum types.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Waldo", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find enum values.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Waldo.FRED", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find extensions.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("plugh", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find services.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Xyzzy", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find methods.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("Xyzzy.Thud", &file));
    EXPECT_EQ("foo.proto", file.name());
  }

  {
    // Can find things in packages.
    FileDescriptorProto file;
    EXPECT_TRUE(database_->FindFileContainingSymbol("corge.Bar", &file));
    EXPECT_EQ("bar.proto", file.name());
  }

  {
    // Fails to find undefined symbols.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileContainingSymbol("Baz", &file));
  }

  {
    // Names must be fully-qualified.
    FileDescriptorProto file;
    EXPECT_FALSE(database_->FindFileContainingSymbol("Bar", &file));
  }
}